

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextAnalyzer.cpp
# Opt level: O1

unsigned_long TextAnalyzer::findOperator(string *toSeparate,short *opLen)

{
  ulong *puVar1;
  undefined1 auVar2 [8];
  ulong *puVar3;
  ulong *puVar4;
  char cVar5;
  ulong uVar6;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  unsigned_long local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 local_60 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmpVec1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tmpVec2;
  
  *opLen = 2;
  local_98 = std::__cxx11::string::find((char *)toSeparate,0x120689,0);
  local_90 = std::__cxx11::string::find((char *)toSeparate,0x12068c,0);
  local_88 = std::__cxx11::string::find((char *)toSeparate,0x120686,0);
  local_80 = std::__cxx11::string::find((char *)toSeparate,0x120683,0);
  local_78 = std::__cxx11::string::find((char *)toSeparate,0x12068c,0);
  __l._M_len = 5;
  __l._M_array = &local_98;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60,__l,
             (allocator_type *)
             &tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar1 = (ulong *)((long)local_60 + 8);
  auVar2 = local_60;
  if (puVar1 != tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start &&
      local_60 !=
      (undefined1  [8])
      tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      puVar3 = puVar1;
      if (*(ulong *)auVar2 <= *puVar1) {
        puVar3 = (ulong *)auVar2;
      }
      auVar2 = (undefined1  [8])puVar3;
      puVar1 = puVar1 + 1;
    } while (puVar1 != tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  }
  uVar6 = *(ulong *)auVar2;
  if (uVar6 == 0xffffffffffffffff) {
    cVar5 = (char)toSeparate;
    local_98 = std::__cxx11::string::find(cVar5,0x3d);
    local_90 = std::__cxx11::string::find(cVar5,0x3c);
    local_88 = std::__cxx11::string::find(cVar5,0x3e);
    local_80 = std::__cxx11::string::find(cVar5,0x7b);
    local_78 = std::__cxx11::string::find(cVar5,0x7d);
    local_70 = std::__cxx11::string::find(cVar5,0x28);
    local_68 = std::__cxx11::string::find(cVar5,0x29);
    __l_00._M_len = 7;
    __l_00._M_array = &local_98;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__l_00,
               (allocator_type *)
               ((long)&tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    puVar1 = tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 1;
    puVar3 = tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar4 = tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (puVar1 != tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start &&
        tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage !=
        tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        puVar3 = puVar1;
        if (*puVar4 <= *puVar1) {
          puVar3 = puVar4;
        }
        puVar1 = puVar1 + 1;
        puVar4 = puVar3;
      } while (puVar1 != tmpVec2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start);
    }
    uVar6 = *puVar3;
    *opLen = 1;
    if (tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)tmpVec2.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)tmpVec1.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_60,
                    (long)tmpVec1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_60);
  }
  return uVar6;
}

Assistant:

unsigned long TextAnalyzer::findOperator(string &toSeparate, short &opLen) {
    opLen = 2;
    vector<unsigned long> tmpVec1 = {toSeparate.find("=="), toSeparate.find("!="), toSeparate.find(">="), toSeparate
            .find("<="), toSeparate.find("!=")};
    auto it1 = min_element(tmpVec1.begin(), tmpVec1.end());
    unsigned long index = *(it1);
    if (index == string::npos) {// ==,!=,>=,<=,!= wasn't found - search =,<,>
        vector<unsigned long> tmpVec2 = {toSeparate.find('='), toSeparate.find('<'), toSeparate.find('>'), toSeparate
                .find('{'), toSeparate.find('}'), toSeparate.find('('), toSeparate.find(')')};
        auto it2 = min_element(tmpVec2.begin(), tmpVec2.end());
        index = *(it2);
        opLen = 1;
    }
    return index;
}